

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O0

uint Fxu_PairHashKeyArray(Fxu_Matrix *p,int *piVarsC1,int *piVarsC2,int nVarsC1,int nVarsC2)

{
  uint local_38;
  int local_34;
  uint Key;
  int i;
  int Offset2;
  int Offset1;
  int nVarsC2_local;
  int nVarsC1_local;
  int *piVarsC2_local;
  int *piVarsC1_local;
  Fxu_Matrix *p_local;
  
  local_38 = 0;
  for (local_34 = 0; local_34 < nVarsC1; local_34 = local_34 + 1) {
    local_38 = s_Primes[local_34 + 100] * piVarsC1[local_34] ^ local_38;
  }
  for (local_34 = 0; local_34 < nVarsC2; local_34 = local_34 + 1) {
    local_38 = s_Primes[local_34 + 200] * piVarsC2[local_34] ^ local_38;
  }
  return local_38;
}

Assistant:

unsigned Fxu_PairHashKeyArray( Fxu_Matrix * p, int piVarsC1[], int piVarsC2[], int nVarsC1, int nVarsC2 )
{
    int Offset1 = 100, Offset2 = 200, i;
    unsigned Key;
    // compute the hash key
    Key = 0;
    for ( i = 0; i < nVarsC1; i++ )
        Key ^= s_Primes[Offset1+i] * piVarsC1[i];
    for ( i = 0; i < nVarsC2; i++ )
        Key ^= s_Primes[Offset2+i] * piVarsC2[i];
    return Key;
}